

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlmodelserialiser.cpp
# Opt level: O2

bool __thiscall
HtmlModelSerialiserPrivate::writeHtml(HtmlModelSerialiserPrivate *this,QXmlStreamWriter *writer)

{
  QAbstractItemModel *pQVar1;
  byte bVar2;
  QString modelName;
  QArrayDataPointer<char16_t> local_a8;
  Data *local_90;
  char16_t *local_88;
  QAbstractItemModel *pQStack_80;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_38;
  
  if ((this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
      m_constModel == (QAbstractItemModel *)0x0) {
    bVar2 = 0;
  }
  else {
    if (this->m_printStartDocument == true) {
      local_90 = (Data *)0x0;
      local_88 = L"<!DOCTYPE html>";
      pQStack_80 = (QAbstractItemModel *)0xf;
      local_a8.d = (Data *)0x0;
      local_a8.ptr = (char16_t *)0x0;
      local_a8.size = 0;
      QXmlStreamWriter::writeDTD((QString *)writer);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      local_90 = (Data *)0x0;
      local_88 = L"html";
      pQStack_80 = (QAbstractItemModel *)0x4;
      local_a8.d = (Data *)0x0;
      local_a8.ptr = (char16_t *)0x0;
      local_a8.size = 0;
      QXmlStreamWriter::writeStartElement((QString *)writer);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      local_90 = (Data *)0x0;
      local_88 = L"head";
      pQStack_80 = (QAbstractItemModel *)0x4;
      local_a8.d = (Data *)0x0;
      local_a8.ptr = (char16_t *)0x0;
      local_a8.size = 0;
      QXmlStreamWriter::writeStartElement((QString *)writer);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      local_90 = (Data *)0x0;
      local_88 = L"meta";
      pQStack_80 = (QAbstractItemModel *)0x4;
      local_a8.d = (Data *)0x0;
      local_a8.ptr = (char16_t *)0x0;
      local_a8.size = 0;
      QXmlStreamWriter::writeEmptyElement((QString *)writer);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      local_90 = (Data *)0x0;
      local_88 = L"charset";
      pQStack_80 = (QAbstractItemModel *)0x7;
      local_a8.size = 0;
      local_58.d = (Data *)0x0;
      local_a8.d = (Data *)0x0;
      local_a8.ptr = (char16_t *)0x0;
      local_58.ptr = L"UTF-8";
      local_58.size = 5;
      local_78.d = (Data *)0x0;
      local_78.ptr = (char16_t *)0x0;
      local_78.size = 0;
      QXmlStreamWriter::writeAttribute((QString *)writer,(QString *)&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      local_90 = (Data *)0x0;
      local_88 = L"title";
      pQStack_80 = (QAbstractItemModel *)0x5;
      local_a8.d = (Data *)0x0;
      local_a8.ptr = (char16_t *)0x0;
      local_a8.size = 0;
      QXmlStreamWriter::writeStartElement((QString *)writer);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      QObject::objectName();
      pQVar1 = pQStack_80;
      if (pQStack_80 == (QAbstractItemModel *)0x0) {
        local_a8.d = (Data *)0x0;
        local_a8.ptr = L"Model";
        local_a8.size = 5;
        local_58.d = (Data *)0x0;
        local_58.ptr = (char16_t *)0x0;
        local_58.size = 0;
      }
      else {
        local_a8.d = local_90;
        local_a8.ptr = local_88;
        local_a8.size = (qsizetype)pQStack_80;
        if (local_90 != (Data *)0x0) {
          LOCK();
          (local_90->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (local_90->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
      }
      QXmlStreamWriter::writeCharacters((QString *)writer);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      if (pQVar1 == (QAbstractItemModel *)0x0) {
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      }
      QXmlStreamWriter::writeEndElement();
      local_a8.d = (Data *)0x0;
      local_a8.ptr = L"style";
      local_a8.size = 5;
      local_78.d = (Data *)0x0;
      local_78.ptr = (char16_t *)0x0;
      local_78.size = 0;
      QXmlStreamWriter::writeStartElement((QString *)writer);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      local_a8.d = (Data *)0x0;
      local_a8.ptr = 
      L"table, th, td { border: 1px solid black; } table { border-collapse: collapse; width: 100%; }"
      ;
      local_a8.size = 0x5c;
      local_78.d = (Data *)0x0;
      local_78.ptr = (char16_t *)0x0;
      local_78.size = 0;
      QXmlStreamWriter::writeCharacters((QString *)writer);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      QXmlStreamWriter::writeEndElement();
      QXmlStreamWriter::writeEndElement();
      local_a8.d = (Data *)0x0;
      local_a8.ptr = L"body";
      local_a8.size = 4;
      local_78.d = (Data *)0x0;
      local_78.ptr = (char16_t *)0x0;
      local_78.size = 0;
      QXmlStreamWriter::writeStartElement((QString *)writer);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_90);
    }
    local_90 = (Data *)0x0;
    local_88 = L"div";
    pQStack_80 = (QAbstractItemModel *)0x3;
    local_a8.d = (Data *)0x0;
    local_a8.ptr = (char16_t *)0x0;
    local_a8.size = 0;
    QXmlStreamWriter::writeStartElement((QString *)writer);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_90);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    local_90 = (Data *)0x0;
    local_88 = L"data-modelcode";
    pQStack_80 = (QAbstractItemModel *)0xe;
    local_a8.size = 0;
    local_78.d = (Data *)0x0;
    local_a8.d = (Data *)0x0;
    local_a8.ptr = (char16_t *)0x0;
    local_78.ptr = L"808FC674-78A0-4682-9C17-E05B18A0CDD3";
    local_78.size = 0x24;
    local_38.d = (Data *)0x0;
    local_38.ptr = (char16_t *)0x0;
    local_38.size = 0;
    QXmlStreamWriter::writeAttribute((QString *)writer,(QString *)&local_90);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_90);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    local_90 = (Data *)0xffffffffffffffff;
    local_88 = (char16_t *)0x0;
    pQStack_80 = (QAbstractItemModel *)0x0;
    writeHtmlElement(this,writer,(QModelIndex *)&local_90);
    QXmlStreamWriter::writeEndElement();
    if (this->m_printStartDocument == true) {
      QXmlStreamWriter::writeEndElement();
      QXmlStreamWriter::writeEndElement();
    }
    bVar2 = QXmlStreamWriter::hasError();
    bVar2 = bVar2 ^ 1;
  }
  return (bool)bVar2;
}

Assistant:

bool HtmlModelSerialiserPrivate::writeHtml(QXmlStreamWriter &writer) const
{
    if (!m_constModel)
        return false;
    if (m_printStartDocument) {
        writer.writeDTD(QStringLiteral("<!DOCTYPE html>"));
        writer.writeStartElement(QStringLiteral("html"));
        writer.writeStartElement(QStringLiteral("head"));
        writer.writeEmptyElement(QStringLiteral("meta"));
#if (QT_VERSION < QT_VERSION_CHECK(6, 0, 0))
        writer.writeAttribute(QStringLiteral("charset"), QString::fromLatin1(writer.codec()->name()));
#else
        writer.writeAttribute(QStringLiteral("charset"), QStringLiteral("UTF-8"));
#endif
        writer.writeStartElement(QStringLiteral("title"));
        const QString modelName = m_constModel->objectName();
        writer.writeCharacters(modelName.isEmpty() ? QStringLiteral("Model") : modelName);
        writer.writeEndElement(); // title
        writer.writeStartElement(QStringLiteral("style"));
        writer.writeCharacters(QStringLiteral("table, th, td { border: 1px solid black; } table { border-collapse: collapse; width: 100%; }"));
        writer.writeEndElement(); // style
        writer.writeEndElement(); // head
        writer.writeStartElement(QStringLiteral("body"));
    }
    writer.writeStartElement(QStringLiteral("div"));
    writer.writeAttribute(QStringLiteral("data-modelcode"), Magic_Model_Header);
    writeHtmlElement(writer);
    writer.writeEndElement(); // div
    if (m_printStartDocument) {
        writer.writeEndElement(); // body
        writer.writeEndElement(); // html
    }
    return !writer.hasError();
}